

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

void __thiscall OB::Parg::set(Parg *this,string *_name,string *_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *pmVar1;
  pointer pcVar2;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  undefined1 auVar11 [8];
  undefined1 local_2d0 [8];
  stringstream out;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [7];
  ios_base local_250 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string delim;
  long local_60;
  long lStack_58;
  undefined1 local_50 [8];
  string _short;
  
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&delim._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,",","");
  lVar3 = std::__cxx11::string::find
                    ((char *)_name,
                     (ulong)names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  if (lVar3 == -1) {
    if (_name->_M_string_length == 1) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->flags_,_name);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      pmVar1 = &this->data_;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      pmVar5->mode_ = true;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_replace
                ((ulong)&pmVar5->value_,0,(char *)(pmVar5->value_)._M_string_length,0x10e39d);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "  -",_name);
      plVar6 = (long *)std::__cxx11::string::append(local_50);
      local_2d0 = (undefined1  [8])local_2c0;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar9) {
        local_2c0[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_2c0[0]._8_8_ = plVar6[3];
      }
      else {
        local_2c0[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_2d0 = (undefined1  [8])*plVar6;
      }
      _out = plVar6[1];
      *plVar6 = (long)paVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_2d0);
    }
    else {
      pmVar1 = &this->data_;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      pmVar5->mode_ = true;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::operator[](pmVar1,_name);
      std::__cxx11::string::_M_replace
                ((ulong)&pmVar5->value_,0,(char *)(pmVar5->value_)._M_string_length,0x10e39d);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "  --",_name);
      plVar6 = (long *)std::__cxx11::string::append(local_50);
      local_2d0 = (undefined1  [8])local_2c0;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar9) {
        local_2c0[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_2c0[0]._8_8_ = plVar6[3];
      }
      else {
        local_2c0[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_2d0 = (undefined1  [8])*plVar6;
      }
      _out = plVar6[1];
      *plVar6 = (long)paVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_2d0);
    }
    if (local_2d0 != (undefined1  [8])local_2c0) {
      operator_delete((void *)local_2d0,local_2c0[0]._M_allocated_capacity + 1);
    }
    if (local_50 == (undefined1  [8])&_short._M_string_length) goto LAB_00106c1d;
    uVar10 = CONCAT71(_short._M_string_length._1_7_,(undefined1)_short._M_string_length);
    auVar11 = local_50;
  }
  else {
    local_2d0 = (undefined1  [8])local_2c0;
    _out = 0;
    local_2c0[0]._M_allocated_capacity = local_2c0[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_50 = (undefined1  [8])&_short._M_string_length;
    _short._M_dataplus._M_p = (pointer)0x0;
    _short._M_string_length._0_1_ = 0;
    pcVar2 = (_name->_M_dataplus)._M_p;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar2,pcVar2 + _name->_M_string_length);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,
               names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               delim._M_dataplus._M_p +
               (long)names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    delimit((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8,this,&local_128,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [8])
         names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == local_a8) ||
       (0x40 < (ulong)((long)names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_a8))) {
      __assert_fail("names.size() >= 1 && names.size() <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]nansi/src/ob/parg.hh"
                    ,0x137,"void OB::Parg::set(std::string, std::string)");
    }
    std::__cxx11::string::_M_assign((string *)local_2d0);
    if ((long)names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)local_a8 == 0x40) {
      if (((pointer)((long)local_a8 + 0x20))->_M_string_length != 1) {
        __assert_fail("names.at(1).size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]nansi/src/ob/parg.hh"
                      ,0x13e,"void OB::Parg::set(std::string, std::string)");
      }
      std::__cxx11::string::_M_assign((string *)local_50);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->flags_,(key_type *)local_50);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar1 = &this->data_;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d0);
    std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d0);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d0);
    pmVar5->mode_ = true;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_2d0);
    std::__cxx11::string::_M_replace
              ((ulong)&pmVar5->value_,0,(char *)(pmVar5->value_)._M_string_length,0x10e39d);
    std::operator+(&local_148,"  -",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_b8 = *plVar8;
      lStack_b0 = plVar6[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar8;
      local_c8 = (long *)*plVar6;
    }
    local_c0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_2d0);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_d8 = *plVar8;
      lStack_d0 = plVar6[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar8;
      local_e8 = (long *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar6[3];
      delim.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar8;
      delim.field_2._8_8_ = (long *)*plVar6;
    }
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->modes_,delim.field_2._8_8_);
    if ((long *)delim.field_2._8_8_ != &local_60) {
      operator_delete((void *)delim.field_2._8_8_,local_60 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
    if (local_50 != (undefined1  [8])&_short._M_string_length) {
      operator_delete((void *)local_50,
                      CONCAT71(_short._M_string_length._1_7_,(undefined1)_short._M_string_length) +
                      1);
    }
    uVar10 = local_2c0[0]._M_allocated_capacity;
    auVar11 = local_2d0;
    if (local_2d0 == (undefined1  [8])local_2c0) goto LAB_00106c1d;
  }
  operator_delete((void *)auVar11,uVar10 + 1);
LAB_00106c1d:
  std::__cxx11::stringstream::stringstream((stringstream *)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c0,"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_2c0,(_info->_M_dataplus)._M_p,_info->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->modes_,(ulong)local_50);
  if (local_50 != (undefined1  [8])&_short._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(_short._M_string_length._1_7_,(undefined1)_short._M_string_length) + 1)
    ;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2d0);
  std::ios_base::~ios_base(local_250);
  if (names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&delim._M_string_length) {
    operator_delete(names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,delim._M_string_length + 1);
  }
  return;
}

Assistant:

void set(std::string _name, std::string _info)
  {
    // sets a flag
    std::string delim {","};
    if (_name.find(delim) != std::string::npos)
    {
      // short and long
      bool has_short {false};
      std::string _long;
      std::string _short;

      auto const names = delimit(_name, delim);
      assert(names.size() >= 1 && names.size() <= 2);
      _long = names.at(0);

      if (names.size() == 2) has_short = true;
      if (has_short)
      {
        // short name must be one char
        assert(names.at(1).size() == 1);
        _short = names.at(1);
      }

      flags_[_short] = _long;
      data_[_long].long_ = _long;
      data_[_long].short_ = _short;
      data_[_long].mode_ = true;
      data_[_long].value_ = "0";
      modes_.append("  -" + _short + ", --" + _long + "\n");
    }
    else
    {
      if (_name.size() == 1)
      {
        // short
        flags_[_name] = _name;
        data_[_name].long_ = _name;
        data_[_name].short_ = _name;
        data_[_name].mode_ = true;
        data_[_name].value_ = "0";
        modes_.append("  -" + _name + "\n");
      }
      else
      {
        // long
        data_[_name].long_ = _name;
        data_[_name].mode_ = true;
        data_[_name].value_ = "0";
        modes_.append("  --" + _name + "\n");
      }
    }

    std::stringstream out;
    out << "    " << _info << "\n";
    modes_.append(out.str());
  }